

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O1

void __thiscall
vkt::texture::util::TextureBinding::updateTextureData
          (TextureBinding *this,TestTextureSp *textureData,Type textureType)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  _func_int **pp_Var3;
  VkImage obj;
  Allocation *pAVar4;
  DeviceInterface *vk;
  Handle<(vk::HandleType)9> HVar5;
  int iVar6;
  VkFormat value;
  uint uVar7;
  uint uVar8;
  VkResult VVar9;
  VkDevice pVVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InstanceInterface *pIVar11;
  VkPhysicalDevice pVVar12;
  NotSupportedError *pNVar13;
  long *plVar14;
  long *plVar15;
  VkImageType VVar16;
  bool bVar17;
  deUint32 queueFamilyIndex;
  Allocator *local_120;
  UVec3 textureDimension;
  undefined1 local_108 [16];
  VkDevice local_f8;
  VkAllocationCallbacks *pVStack_f0;
  VkQueue local_e0;
  VkDevice local_d8;
  DeviceInterface *local_d0;
  Move<vk::Handle<(vk::HandleType)9>_> local_c8;
  VkImageFormatProperties imageFormatProperties;
  VkImageCreateInfo imageParams;
  
  local_d0 = Context::getDeviceInterface(this->m_context);
  pVVar10 = Context::getDevice(this->m_context);
  local_e0 = Context::getUniversalQueue(this->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this->m_context);
  local_120 = Context::getDefaultAllocator(this->m_context);
  this->m_type = textureType;
  pSVar2 = (this->m_textureData).m_state;
  if (pSVar2 != textureData->m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_textureData).m_ptr = (TestTexture *)0x0;
        (*((this->m_textureData).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_textureData).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_textureData).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_textureData).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_textureData).m_ptr = textureData->m_ptr;
    pSVar2 = textureData->m_state;
    (this->m_textureData).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_textureData).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  bVar17 = this->m_type == TYPE_CUBE_MAP;
  VVar16 = (textureType == TYPE_3D) + VK_IMAGE_TYPE_2D;
  local_d8 = pVVar10;
  iVar6 = (*textureData->m_ptr->_vptr_TestTexture[5])();
  pp_Var3 = textureData->m_ptr->_vptr_TestTexture;
  if ((char)iVar6 == '\0') {
    iVar6 = (*pp_Var3[0xe])();
    value = ::vk::mapTextureFormat((TextureFormat *)CONCAT44(extraout_var_00,iVar6));
  }
  else {
    iVar6 = (*pp_Var3[9])(textureData->m_ptr,0,0);
    value = ::vk::mapCompressedTextureFormat(*(CompressedTexFormat *)CONCAT44(extraout_var,iVar6));
  }
  (*textureData->m_ptr->_vptr_TestTexture[0xf])(&textureDimension);
  uVar7 = (*textureData->m_ptr->_vptr_TestTexture[2])();
  uVar8 = (*textureData->m_ptr->_vptr_TestTexture[4])();
  pIVar11 = Context::getInstanceInterface(this->m_context);
  pVVar12 = Context::getPhysicalDevice(this->m_context);
  VVar9 = (*pIVar11->_vptr_InstanceInterface[4])
                    (pIVar11,pVVar12,(ulong)value,(ulong)VVar16,0,6,(ulong)bVar17 << 4,
                     &imageFormatProperties);
  if (VVar9 != VK_ERROR_FORMAT_NOT_SUPPORTED) {
    ::vk::checkResult(VVar9,"imageFormatQueryResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                      ,0x149);
    vk = local_d0;
    pVVar10 = local_d8;
    if (imageFormatProperties.maxArrayLayers < uVar8) {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar13,"Maximum array layers number for this format is not enough for this test.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x14c);
    }
    else if (imageFormatProperties.maxMipLevels < uVar7) {
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar13,"Maximum mimap level number for this format is not enough for this test.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x14f);
    }
    else {
      if (((textureDimension.m_data[0] <= imageFormatProperties.maxExtent.width) &&
          (textureDimension.m_data[1] <= imageFormatProperties.maxExtent.height)) &&
         (textureDimension.m_data[2] <= imageFormatProperties.maxExtent.depth)) {
        imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        imageParams.pNext = (void *)0x0;
        imageParams.flags = (uint)bVar17 << 4;
        imageParams.imageType = VVar16;
        imageParams.extent.width = textureDimension.m_data[0];
        imageParams.format = value;
        imageParams.extent.height = textureDimension.m_data[1];
        imageParams.extent.depth = textureDimension.m_data[2];
        imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
        imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageParams.usage = 6;
        imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageParams.queueFamilyIndexCount = 1;
        imageParams.pQueueFamilyIndices = &queueFamilyIndex;
        imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        imageParams.mipLevels = uVar7;
        imageParams.arrayLayers = uVar8;
        ::vk::createImage(&local_c8,local_d0,local_d8,&imageParams,(VkAllocationCallbacks *)0x0);
        local_f8 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
        pVStack_f0 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                     m_allocator;
        local_108._0_8_ =
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
        local_108._8_8_ =
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
        local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
        local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
             (VkDevice)0x0;
        local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        obj.m_internal =
             (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal;
        if (obj.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    (&(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      deleter,obj);
        }
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
             = local_f8;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = pVStack_f0;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
        m_internal = local_108._0_8_;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)local_108._8_8_;
        if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                     (VkImage)local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                              m_internal);
        }
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)local_108,vk,pVVar10,
                   (VkImage)(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal);
        (*local_120->_vptr_Allocator[3])(&local_c8,local_120,(VkMemoryRequirements *)local_108,0);
        HVar5.m_internal =
             local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
        local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
        pAVar4 = (this->m_textureImageMemory).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        if (pAVar4 != (Allocation *)HVar5.m_internal) {
          if (pAVar4 != (Allocation *)0x0) {
            (*pAVar4->_vptr_Allocation[1])();
            (this->m_textureImageMemory).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
                 (Allocation *)0x0;
          }
          (this->m_textureImageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)HVar5.m_internal;
        }
        if ((long *)local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
            != (long *)0x0) {
          (**(code **)(*(long *)local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                                .m_internal + 8))();
          local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
        }
        pAVar4 = (this->m_textureImageMemory).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        VVar9 = (*vk->_vptr_DeviceInterface[0xd])
                          (vk,pVVar10,
                           (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,(pAVar4->m_memory).m_internal,pAVar4->m_offset);
        ::vk::checkResult(VVar9,
                          "vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                          ,0x172);
        updateTextureViewMipLevels(this,0,uVar7 - 1);
        vkt::pipeline::uploadTestTexture
                  (vk,pVVar10,local_e0,queueFamilyIndex,local_120,(this->m_textureData).m_ptr,
                   (VkImage)(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal);
        return;
      }
      pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar13,"Maximum image dimension for this format is not enough for this test.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x155);
    }
    __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_108._0_8_ = &local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Format not supported: ","");
  ::vk::getFormatName(value);
  plVar14 = (long *)std::__cxx11::string::append(local_108);
  imageParams._0_8_ = *plVar14;
  plVar15 = plVar14 + 2;
  if ((long *)imageParams._0_8_ == plVar15) {
    imageParams._16_8_ = *plVar15;
    imageParams._24_8_ = plVar14[3];
    imageParams._0_8_ = &imageParams.flags;
  }
  else {
    imageParams._16_8_ = *plVar15;
  }
  imageParams.pNext = (void *)plVar14[1];
  *plVar14 = (long)plVar15;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError
            (pNVar13,(char *)imageParams._0_8_,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
             ,0x146);
  __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBinding::updateTextureData (const TestTextureSp& textureData, const TextureBinding::Type textureType)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const VkQueue								queue					= m_context.getUniversalQueue();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();

	m_type			= textureType;
	m_textureData	= textureData;

	const bool									isCube					= m_type == TYPE_CUBE_MAP;
	const VkImageCreateFlags					imageCreateFlags		= isCube ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : 0;
	const VkImageViewType						imageViewType			= textureTypeToImageViewType(textureType);
	const VkImageType							imageType				= imageViewTypeToImageType(imageViewType);
	const VkImageTiling							imageTiling				= VK_IMAGE_TILING_OPTIMAL;
	const VkImageUsageFlags						imageUsageFlags			= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	const VkFormat								format					= textureData->isCompressed() ? mapCompressedTextureFormat(textureData->getCompressedLevel(0, 0).getFormat()) : mapTextureFormat(textureData->getTextureFormat());
	const tcu::UVec3							textureDimension		= textureData->getTextureDimension();
	const deUint32								mipLevels				= textureData->getNumLevels();
	const deUint32								arraySize				= textureData->getArraySize();
	vk::VkImageFormatProperties					imageFormatProperties;
	const VkResult								imageFormatQueryResult	= m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(), format, imageType, imageTiling, imageUsageFlags, imageCreateFlags, &imageFormatProperties);

	if (imageFormatQueryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
	{
		TCU_THROW(NotSupportedError, (std::string("Format not supported: ") + vk::getFormatName(format)).c_str());
	}
	else
		VK_CHECK(imageFormatQueryResult);

	if (imageFormatProperties.maxArrayLayers < arraySize)
		TCU_THROW(NotSupportedError, ("Maximum array layers number for this format is not enough for this test."));

	if (imageFormatProperties.maxMipLevels < mipLevels)
		TCU_THROW(NotSupportedError, ("Maximum mimap level number for this format is not enough for this test."));

	if (imageFormatProperties.maxExtent.width < textureDimension.x() ||
		imageFormatProperties.maxExtent.height < textureDimension.y() ||
		imageFormatProperties.maxExtent.depth < textureDimension.z())
	{
		TCU_THROW(NotSupportedError, ("Maximum image dimension for this format is not enough for this test."));
	}

	// Create image
	const VkImageCreateInfo						imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			(deUint32)textureDimension.x(),
			(deUint32)textureDimension.y(),
			(deUint32)textureDimension.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arraySize,														// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,											// VkSampleCountFlagBits	samples;
		imageTiling,													// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	m_textureImage			= createImage(vkd, vkDevice, &imageParams);
	m_textureImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_textureImage), MemoryRequirement::Any);
	VK_CHECK(vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset()));

	updateTextureViewMipLevels(0, mipLevels - 1);

	pipeline::uploadTestTexture(vkd, vkDevice, queue, queueFamilyIndex, allocator, *m_textureData, *m_textureImage);
}